

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O3

void emit_vars(char *type,char *prefix,PseudoGenerator *gen,TextBuffer *mb)

{
  uint max_reg;
  uint i;
  uint uVar1;
  
  if ((uint)gen != 0) {
    uVar1 = 0;
    do {
      if (uVar1 == 0) {
        raviX_buffer_add_fstring(mb,"%s ",type);
      }
      else {
        raviX_buffer_add_string(mb," = 0, ");
      }
      raviX_buffer_add_fstring(mb,"%s%d",prefix,(ulong)uVar1);
      uVar1 = uVar1 + 1;
    } while ((uint)gen != uVar1);
    raviX_buffer_add_string(mb," = 0;\n");
    return;
  }
  return;
}

Assistant:

static void emit_vars(const char *type, const char *prefix, PseudoGenerator *gen, TextBuffer *mb)
{
	unsigned max_reg = raviX_max_reg(gen);
	if (max_reg == 0)
		return;
	for (unsigned i = 0; i < max_reg; i++) {
		if (i == 0) {
			raviX_buffer_add_fstring(mb, "%s ", type);
		}
		else {
			raviX_buffer_add_string(mb, " = 0, ");
		}
		raviX_buffer_add_fstring(mb, "%s%d", prefix, i);
	}
	raviX_buffer_add_string(mb, " = 0;\n");
}